

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

bool __thiscall JsrtDebugManager::CanHalt(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  bool bVar2;
  int byteCodeOffset;
  undefined4 *puVar3;
  FunctionBody *this_00;
  StatementMap *pSVar4;
  
  bVar2 = Js::InterpreterHaltState::IsValid(haltState);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x54,"(haltState->IsValid())","haltState->IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = Js::InterpreterHaltState::GetFunction(haltState);
  byteCodeOffset = Js::InterpreterHaltState::GetCurrentOffset(haltState);
  bVar2 = false;
  pSVar4 = Js::FunctionBody::GetMatchingStatementMapFromByteCode(this_00,byteCodeOffset,false);
  if (((pSVar4 != (StatementMap *)0x0) &&
      (bVar2 = true,
      ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) != 0)) &&
     ((pSVar4->sourceSpan).begin == 0)) {
    bVar2 = (pSVar4->sourceSpan).end != 0;
  }
  return bVar2;
}

Assistant:

bool JsrtDebugManager::CanHalt(Js::InterpreterHaltState* haltState)
{
    // This is registered as the callback for inline breakpoints.
    // We decide here if we are at a reasonable stop location that has source code.
    Assert(haltState->IsValid());

    Js::FunctionBody* pCurrentFuncBody = haltState->GetFunction();
    int byteOffset = haltState->GetCurrentOffset();
    Js::FunctionBody::StatementMap* map = pCurrentFuncBody->GetMatchingStatementMapFromByteCode(byteOffset, false);

    // Resolve the dummy ret code.
    return map != nullptr && (!pCurrentFuncBody->GetIsGlobalFunc() || !Js::FunctionBody::IsDummyGlobalRetStatement(&map->sourceSpan));
}